

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O0

void tlb_init_mips64(CPUState *cpu)

{
  CPUArchState_conflict10 *env_00;
  int64_t now_00;
  CPUTLB_conflict4 *pCVar1;
  CPUTLB_conflict4 *pCVar2;
  int local_24;
  int i;
  int64_t now;
  CPUArchState_conflict10 *env;
  CPUState *cpu_local;
  
  env_00 = (CPUArchState_conflict10 *)cpu->env_ptr;
  now_00 = get_clock_realtime();
  pCVar1 = env_tlb(env_00);
  (pCVar1->c).dirty = 0;
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    pCVar1 = env_tlb(env_00);
    pCVar2 = env_tlb(env_00);
    tlb_mmu_init(pCVar1->d + local_24,pCVar2->f + local_24,now_00);
  }
  return;
}

Assistant:

void tlb_init(CPUState *cpu)
{
    CPUArchState *env = cpu->env_ptr;
    int64_t now = get_clock_realtime();
    int i;

    /* All tlbs are initialized flushed. */
    env_tlb(env)->c.dirty = 0;

    for (i = 0; i < NB_MMU_MODES; i++) {
        tlb_mmu_init(&env_tlb(env)->d[i], &env_tlb(env)->f[i], now);
    }
}